

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int update_remote_initial_window_size_func(void *entry,void *ptr)

{
  int iVar1;
  int iVar2;
  nghttp2_session *in_RSI;
  nghttp2_stream *in_RDI;
  uint32_t unaff_retaddr;
  int32_t unaff_retaddr_00;
  nghttp2_stream *stream;
  nghttp2_update_window_size_arg *arg;
  int rv;
  int32_t in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  uint8_t flags;
  int local_4;
  
  iVar1 = nghttp2_stream_update_remote_initial_window_size
                    (in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  flags = (uint8_t)((uint)in_stack_ffffffffffffffcc >> 0x18);
  if (iVar1 == 0) {
    if ((0 < in_RDI->remote_window_size) &&
       (iVar1 = nghttp2_stream_check_deferred_by_flow_control(in_RDI), iVar1 != 0)) {
      iVar1 = session_resume_deferred_stream_item(in_RSI,in_RDI,flags);
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 != 0) {
        return iVar1;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = nghttp2_session_add_rst_stream
                        ((nghttp2_session *)stream,unaff_retaddr_00,unaff_retaddr);
  }
  return local_4;
}

Assistant:

static int update_remote_initial_window_size_func(void *entry, void *ptr) {
  int rv;
  nghttp2_update_window_size_arg *arg;
  nghttp2_stream *stream;

  arg = (nghttp2_update_window_size_arg *)ptr;
  stream = (nghttp2_stream *)entry;

  rv = nghttp2_stream_update_remote_initial_window_size(
    stream, arg->new_window_size, arg->old_window_size);
  if (rv != 0) {
    return nghttp2_session_add_rst_stream(arg->session, stream->stream_id,
                                          NGHTTP2_FLOW_CONTROL_ERROR);
  }

  /* If window size gets positive, push deferred DATA frame to
     outbound queue. */
  if (stream->remote_window_size > 0 &&
      nghttp2_stream_check_deferred_by_flow_control(stream)) {
    rv = session_resume_deferred_stream_item(
      arg->session, stream, NGHTTP2_STREAM_FLAG_DEFERRED_FLOW_CONTROL);

    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }
  return 0;
}